

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O2

void ncnn::conv3x3s1_winograd23_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int _c;
  float *pfVar13;
  int kk;
  ulong uVar14;
  float *pfVar15;
  long lVar16;
  int m_1;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined8 local_160;
  undefined1 local_158 [12];
  float fStack_14c;
  size_t local_148;
  float local_140 [2];
  undefined8 local_138;
  int local_130;
  int local_12c;
  int local_128;
  undefined8 local_124;
  size_t local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  float *local_e8;
  Allocator *local_e0;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat local_c8;
  Mat m;
  
  uVar9 = (ulong)(uint)inch;
  local_160 = AT;
  get_optimal_tile_mnk(outch,0,inch,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
  local_110 = (ulong)(uint)TILE_M;
  _c = (outch + TILE_M + -1) / TILE_M;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_108 = (ulong)(uint)outch;
  Mat::create(&local_c8,TILE_K * TILE_M * 0x10,1,opt->num_threads,4,(Allocator *)0x0);
  Mat::create(local_160,TILE_K * TILE_M,0x10,(inch + TILE_K + -1) / TILE_K,_c,4,(Allocator *)0x0);
  if (_c < 1) {
    _c = 0;
  }
  uVar12 = 0;
  local_f8 = uVar9;
  while (iVar18 = (int)uVar12, iVar18 != _c) {
    iVar7 = get_omp_thread_num();
    m.elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    local_e8 = (float *)((long)iVar7 * local_c8.cstep * m.elemsize + (long)local_c8.data);
    m.data = local_e8;
    m.refcount = (int *)0x0;
    m.elempack = local_c8.elempack;
    m.allocator = local_c8.allocator;
    m.w = local_c8.w;
    m.h = local_c8.h;
    m.d = 1;
    m.c = local_c8.d;
    m.cstep = (m.elemsize * (long)local_c8.h * (long)local_c8.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = local_c8.dims + -1;
    if (local_c8.dims == 4) {
      m.cstep = (long)local_c8.h * (long)local_c8.w;
    }
    iVar7 = (int)local_110 * iVar18;
    uVar10 = (int)local_108 - iVar7;
    uVar11 = (ulong)uVar10;
    if ((int)local_110 < (int)uVar10) {
      uVar11 = local_110 & 0xffffffff;
    }
    iVar8 = 0;
    uVar19 = 0;
    if (0 < (int)uVar11) {
      uVar19 = uVar11;
    }
    local_100 = uVar12;
    local_f0 = (long)iVar18;
    for (; uVar10 = (int)uVar9 - iVar8, uVar10 != 0 && iVar8 <= (int)uVar9; iVar8 = iVar8 + TILE_K)
    {
      if (TILE_K < (int)uVar10) {
        uVar10 = TILE_K;
      }
      uVar9 = 0;
      if (0 < (int)uVar10) {
        uVar9 = (ulong)uVar10;
      }
      pfVar13 = local_e8;
      for (uVar12 = 0; uVar12 != uVar19; uVar12 = uVar12 + 1) {
        pvVar4 = kernel->data;
        for (uVar14 = 0; uVar14 != uVar9; uVar14 = uVar14 + 1) {
          pfVar15 = (float *)((long)pvVar4 +
                             (uVar14 + (long)iVar8) * 0x24 +
                             (long)(((int)uVar12 + iVar7) * inch * 9) * 4);
          for (lVar17 = 0; lVar16 = 8, lVar17 != 3; lVar17 = lVar17 + 1) {
            fVar1 = *pfVar15;
            fVar2 = pfVar15[2];
            fVar3 = pfVar15[1];
            *(float *)(local_158 + lVar17 * 4) = fVar1;
            fVar1 = fVar1 * 0.5;
            fVar5 = fVar2 * 0.5;
            (&fStack_14c)[lVar17] = fVar3 * 0.5 + fVar1 + fVar5;
            local_140[lVar17] = (fVar1 - fVar3 * 0.5) + fVar5;
            *(float *)((long)&local_138 + lVar17 * 4 + 4) = fVar2;
            pfVar15 = pfVar15 + 3;
          }
          for (; lVar16 != 0x38; lVar16 = lVar16 + 0xc) {
            fVar1 = *(float *)(local_158 + lVar16);
            fVar2 = *(float *)((long)&local_160 + lVar16 + 4) * 0.5;
            fVar3 = *(float *)((long)&local_160 + lVar16) * 0.5;
            fVar5 = fVar1 * 0.5;
            *pfVar13 = *(float *)((long)&local_160 + lVar16);
            pfVar13[1] = fVar2 + fVar3 + fVar5;
            pfVar13[2] = (fVar3 - fVar2) + fVar5;
            pfVar13[3] = fVar1;
            pfVar13 = pfVar13 + 4;
          }
        }
      }
      local_12c = local_160->w;
      local_128 = local_160->h;
      local_148 = local_160->elemsize;
      local_140[0] = (float)local_160->elempack;
      local_138 = local_160->allocator;
      local_118 = (long)local_128 * (long)local_12c;
      local_158._0_8_ =
           (long)local_160->data +
           local_148 * local_118 * (long)(iVar8 / TILE_K) + local_160->cstep * local_f0 * local_148;
      stack0xfffffffffffffeb0 = (int *)0x0;
      local_130 = 2;
      local_124._0_4_ = 1;
      local_124._4_4_ = 1;
      local_e0 = local_138;
      pack_A_tile(&m,(Mat *)local_158,0x10,(int)uVar11,uVar10);
      uVar9 = local_f8;
    }
    uVar12 = (ulong)((int)local_100 + 1);
  }
  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 16;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd23_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}